

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_bind_int64(sqlite3_stmt *pStmt,int i,sqlite_int64 iValue)

{
  int iVar1;
  uint in_ESI;
  Vdbe *in_RDI;
  Vdbe *p;
  int rc;
  uint in_stack_ffffffffffffffe0;
  
  iVar1 = vdbeUnbind(in_RDI,in_ESI);
  if (iVar1 == 0) {
    sqlite3VdbeMemSetInt64((Mem *)(ulong)in_stack_ffffffffffffffe0,(i64)in_RDI);
    sqlite3_mutex_leave((sqlite3_mutex *)0x1411d7);
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_bind_int64(sqlite3_stmt *pStmt, int i, sqlite_int64 iValue){
  int rc;
  Vdbe *p = (Vdbe *)pStmt;
  rc = vdbeUnbind(p, (u32)(i-1));
  if( rc==SQLITE_OK ){
    assert( p!=0 && p->aVar!=0 && i>0 && i<=p->nVar ); /* tag-20240917-01 */
    sqlite3VdbeMemSetInt64(&p->aVar[i-1], iValue);
    sqlite3_mutex_leave(p->db->mutex);
  }
  return rc;
}